

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapRule.c
# Opt level: O2

int Amap_CreateCheckAllZero(Vec_Ptr_t *vVecNods)

{
  int iVar1;
  Vec_Int_t *p;
  int i;
  
  i = vVecNods->nSize;
  while( true ) {
    if (i < 1) {
      return 1;
    }
    i = i + -1;
    p = (Vec_Int_t *)Vec_PtrEntry(vVecNods,i);
    if (p->nSize != 1) break;
    iVar1 = Vec_IntEntry(p,0);
    if (iVar1 != 0) {
      return 0;
    }
  }
  return 0;
}

Assistant:

int Amap_CreateCheckAllZero( Vec_Ptr_t * vVecNods )
{
    Vec_Int_t * vNods;
    int i;
    Vec_PtrForEachEntryReverse( Vec_Int_t *, vVecNods, vNods, i )
        if ( Vec_IntSize(vNods) != 1 || Vec_IntEntry(vNods,0) != 0 )
            return 0;
    return 1;
}